

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O3

QueryResult * __thiscall
DiskTable::get(QueryResult *__return_storage_ptr__,DiskTable *this,longlong key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  SSTableDataEntry local_80;
  _List_node_base *local_40;
  DiskTable *local_38;
  
  p_Var5 = (_List_node_base *)
           (this->diskView).
           super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (_List_node_base *)
             (this->diskView).
             super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (p_Var5 != local_40) {
    paVar1 = &local_80.value.field_2;
    do {
      p_Var6 = p_Var5->_M_next;
      p_Var2 = p_Var5;
      if (p_Var5 == (_List_node_base *)
                    (local_38->diskView).
                    super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        for (; p_Var2 != p_Var6; p_Var2 = p_Var2->_M_prev) {
          bVar3 = DiskTableNode::mightIn((DiskTableNode *)(p_Var2->_M_prev + 1),key);
          if (bVar3) {
            DiskTableNode::getEntry(&local_80,(DiskTableNode *)(p_Var2->_M_prev + 1),key);
            if (0 < local_80.timestamp) {
              if (local_80.delete_flag != true) goto LAB_00106df8;
              __return_storage_ptr__->success = false;
              (__return_storage_ptr__->data)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->data).field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&__return_storage_ptr__->data,"");
              goto LAB_00106ddf;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80.value._M_dataplus._M_p != paVar1) {
              operator_delete(local_80.value._M_dataplus._M_p,
                              local_80.value.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      else {
        for (; p_Var6 != p_Var5;
            p_Var6 = (((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)&p_Var6->_M_next
                      )->_M_impl)._M_node.super__List_node_base._M_next) {
          bVar3 = DiskTableNode::mightIn((DiskTableNode *)(p_Var6 + 1),key);
          if (bVar3) {
            DiskTableNode::getEntry(&local_80,(DiskTableNode *)(p_Var6 + 1),key);
            if (0 < local_80.timestamp) {
              if (local_80.delete_flag != true) {
LAB_00106df8:
                paVar4 = &(__return_storage_ptr__->data).field_2;
                __return_storage_ptr__->success = true;
                (__return_storage_ptr__->data)._M_dataplus._M_p = (pointer)paVar4;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_80.value._M_dataplus._M_p == paVar1) {
                  paVar4->_M_allocated_capacity = local_80.value.field_2._M_allocated_capacity;
                  *(undefined8 *)((long)&(__return_storage_ptr__->data).field_2 + 8) =
                       local_80.value.field_2._8_8_;
                }
                else {
                  (__return_storage_ptr__->data)._M_dataplus._M_p = local_80.value._M_dataplus._M_p;
                  paVar4->_M_allocated_capacity = local_80.value.field_2._M_allocated_capacity;
                }
                (__return_storage_ptr__->data)._M_string_length = local_80.value._M_string_length;
                return __return_storage_ptr__;
              }
              __return_storage_ptr__->success = false;
              (__return_storage_ptr__->data)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->data).field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&__return_storage_ptr__->data,"");
LAB_00106ddf:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80.value._M_dataplus._M_p == paVar1) {
                return __return_storage_ptr__;
              }
              operator_delete(local_80.value._M_dataplus._M_p,
                              local_80.value.field_2._M_allocated_capacity + 1);
              return __return_storage_ptr__;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80.value._M_dataplus._M_p != paVar1) {
              operator_delete(local_80.value._M_dataplus._M_p,
                              local_80.value.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      p_Var5 = (_List_node_base *)&p_Var5[1]._M_prev;
    } while (p_Var5 != local_40);
  }
  __return_storage_ptr__->success = false;
  (__return_storage_ptr__->data)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->data).field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__return_storage_ptr__->data,"");
  return __return_storage_ptr__;
}

Assistant:

DiskTable::QueryResult DiskTable::get(long long int key) {
    auto cur_level = diskView.begin();
    auto level_end = diskView.end();
    for (; cur_level != level_end; cur_level++) {
        if (cur_level == diskView.begin()) {
            // To ensure correctness of result, we should lookup one written to disk later first in level 0 (if there are two sstable already).
            auto cur_node = cur_level->rbegin();
            auto rend = cur_level->rend();
            for (; cur_node != rend; cur_node++) {
                if (cur_node->mightIn(key)) {
                    auto res = cur_node->getEntry(key);
                    if (cur_node->valid(res)) {
                        if (res.delete_flag) {
                            // Delete record must leave in disk.
                            // See also comment in DiskTableNode#valid.
                            return {false, ""};
                        }
                        return {true, std::move(res.value)};
                    }
                }
            }
        } else {
            auto cur_node = cur_level->begin();
            auto end = cur_level->end();
            for (; cur_node != end; cur_node++) {
                if (cur_node->mightIn(key)) {
                    auto res = cur_node->getEntry(key);
                    if (cur_node->valid(res)) {
                        if (res.delete_flag) {
                            return {false, ""};
                        }
                        return {true, std::move(res.value)};
                    }
                }
            }
        }
    }
    return {false, ""};
}